

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::SingleCapPipeline::~SingleCapPipeline
          (SingleCapPipeline *this)

{
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_0066f3a0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0066f3d8;
  kj::Own<capnp::ClientHook>::dispose(&this->cap);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

SingleCapPipeline(kj::Own<ClientHook>&& cap)
        : cap(kj::mv(cap)) {}